

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O0

void disruptor::test::BusySpinStrategy::WaitForDependents_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  WaitForDependents t;
  char (*in_stack_fffffffffffff438) [19];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff440;
  std_string *in_stack_fffffffffffff448;
  basic_cstring<const_char> *in_stack_fffffffffffff450;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff460;
  basic_wrap_stringstream<char> *pbVar2;
  undefined1 local_ad0 [400];
  WaitForDependents *in_stack_fffffffffffff6c0;
  undefined1 local_938 [16];
  basic_cstring<const_char> local_928;
  undefined1 local_911;
  basic_wrap_stringstream<char> local_910;
  undefined1 local_778 [16];
  basic_cstring<const_char> local_768;
  undefined1 local_751;
  basic_wrap_stringstream<char> local_750;
  undefined1 local_5b8 [16];
  basic_cstring<const_char> local_5a8;
  undefined1 local_591;
  basic_wrap_stringstream<char> local_590;
  undefined1 local_3f8 [16];
  basic_cstring<const_char> local_3e8 [34];
  undefined1 local_1b9;
  basic_wrap_stringstream<char> local_1b8;
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_1b8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref(&local_1b8);
  local_1b9 = 0x22;
  boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [18])in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [15])in_stack_fffffffffffff438);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff460);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,&local_10,0x61,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff440);
  WaitForDependents::WaitForDependents((WaitForDependents *)0x11703f);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_590,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref(&local_590);
  local_591 = 0x22;
  boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [18])in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [16])in_stack_fffffffffffff438);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff460);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,local_3e8,0x61,local_3f8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::unit_test::setup_conditional<disruptor::test::BusySpinStrategy::WaitForDependents>
            ((WaitForDependents *)in_stack_fffffffffffff440);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_5a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_750,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref(&local_750);
  local_751 = 0x22;
  boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [18])in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [13])in_stack_fffffffffffff438);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff460);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,&local_5a8,0x61,local_5b8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff440);
  WaitForDependents::test_method(in_stack_fffffffffffff6c0);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_768,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(&local_910,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref(&local_910);
  local_911 = 0x22;
  boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,(char (*) [18])in_stack_fffffffffffff438);
  boost::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff460);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,&local_768,0x61,local_778);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::unit_test::teardown_conditional<disruptor::test::BusySpinStrategy::WaitForDependents>
            ((WaitForDependents *)in_stack_fffffffffffff440);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_928,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
             ,0x6b);
  memset(local_ad0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff440);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_ad0);
  this = boost::operator<<(in_stack_fffffffffffff440,*in_stack_fffffffffffff438);
  s = boost::operator<<(in_stack_fffffffffffff440,(char (*) [18])in_stack_fffffffffffff438);
  this_00 = boost::operator<<(in_stack_fffffffffffff440,(char (*) [15])in_stack_fffffffffffff438);
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (pbVar2,&local_928,0x61,local_938,in_R8,in_R9,pbVar1);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_00);
  WaitForDependents::~WaitForDependents((WaitForDependents *)0x117493);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_3.IncrementAndGet(1L);
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}